

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  RTCFilterFunctionN p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong unaff_RBX;
  size_t mask;
  ulong *puVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined4 uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar103 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_c01;
  undefined1 local_c00 [16];
  long local_be8;
  undefined8 local_be0;
  float fStack_bd8;
  float fStack_bd4;
  Scene *local_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  ulong local_b80;
  ulong local_b78;
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  ulong local_b50;
  ulong local_b48;
  ulong *local_b40;
  ulong local_b38;
  RTCFilterFunctionNArguments local_b30;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  int local_a90;
  int iStack_a8c;
  int iStack_a88;
  int iStack_a84;
  int local_a80;
  int iStack_a7c;
  int iStack_a78;
  int iStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar33 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_b70._4_4_ = uVar33;
  local_b70._0_4_ = uVar33;
  local_b70._8_4_ = uVar33;
  local_b70._12_4_ = uVar33;
  auVar92 = ZEXT1664(local_b70);
  local_a00 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_a10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_a50 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a20 = local_a50 * 0.99999964;
  fVar14 = local_a60 * 0.99999964;
  local_a30._4_4_ = fVar14;
  local_a30._0_4_ = fVar14;
  fStack_a28 = fVar14;
  fStack_a24 = fVar14;
  local_a40 = local_a70 * 0.99999964;
  local_a50 = local_a50 * 1.0000004;
  local_a60 = local_a60 * 1.0000004;
  local_a70 = local_a70 * 1.0000004;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar40 = uVar35 ^ 0x10;
  local_b80 = uVar36 ^ 0x10;
  local_b38 = uVar32 ^ 0x10;
  local_a80 = (tray->tnear).field_0.i[k];
  local_a90 = (tray->tfar).field_0.i[k];
  iVar28 = 1 << ((uint)k & 0x1f);
  auVar49._4_4_ = iVar28;
  auVar49._0_4_ = iVar28;
  auVar49._8_4_ = iVar28;
  auVar49._12_4_ = iVar28;
  auVar49._16_4_ = iVar28;
  auVar49._20_4_ = iVar28;
  auVar49._24_4_ = iVar28;
  auVar49._28_4_ = iVar28;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar49 = vpand_avx2(auVar49,auVar16);
  local_940 = vpcmpeqd_avx2(auVar49,auVar16);
  puVar34 = local_7f8;
  uVar37 = local_b80;
  local_b78 = uVar40;
  iStack_a8c = local_a90;
  iStack_a88 = local_a90;
  iStack_a84 = local_a90;
  iStack_a7c = local_a80;
  iStack_a78 = local_a80;
  iStack_a74 = local_a80;
  fStack_a6c = local_a70;
  fStack_a68 = local_a70;
  fStack_a64 = local_a70;
  fStack_a5c = local_a60;
  fStack_a58 = local_a60;
  fStack_a54 = local_a60;
  fStack_a4c = local_a50;
  fStack_a48 = local_a50;
  fStack_a44 = local_a50;
  fStack_a3c = local_a40;
  fStack_a38 = local_a40;
  fStack_a34 = local_a40;
  fStack_a1c = local_a20;
  fStack_a18 = local_a20;
  fStack_a14 = local_a20;
  uStack_a0c = local_a10;
  uStack_a08 = local_a10;
  uStack_a04 = local_a10;
  uStack_9fc = local_a00;
  uStack_9f8 = local_a00;
  uStack_9f4 = local_a00;
  do {
    local_b40 = puVar34;
    if (local_b40 == &local_800) break;
    puVar34 = local_b40 + -1;
    uVar39 = local_b40[-1];
    do {
      if ((uVar39 & 8) == 0) {
        uVar29 = uVar39 & 0xfffffffffffffff0;
        uVar33 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar43._4_4_ = uVar33;
        auVar43._0_4_ = uVar33;
        auVar43._8_4_ = uVar33;
        auVar43._12_4_ = uVar33;
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar35),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar35));
        auVar44 = vsubps_avx(auVar44,auVar92._0_16_);
        auVar50._0_4_ = auVar44._0_4_ * local_a20;
        auVar50._4_4_ = auVar44._4_4_ * fStack_a1c;
        auVar50._8_4_ = auVar44._8_4_ * fStack_a18;
        auVar50._12_4_ = auVar44._12_4_ * fStack_a14;
        auVar44._4_4_ = iStack_a7c;
        auVar44._0_4_ = local_a80;
        auVar44._8_4_ = iStack_a78;
        auVar44._12_4_ = iStack_a74;
        auVar44 = vmaxps_avx(auVar44,auVar50);
        auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar36),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar36));
        auVar18._4_4_ = uStack_9fc;
        auVar18._0_4_ = local_a00;
        auVar18._8_4_ = uStack_9f8;
        auVar18._12_4_ = uStack_9f4;
        auVar17 = vsubps_avx(auVar17,auVar18);
        auVar54._0_4_ = auVar17._0_4_ * (float)local_a30._0_4_;
        auVar54._4_4_ = auVar17._4_4_ * (float)local_a30._4_4_;
        auVar54._8_4_ = auVar17._8_4_ * fStack_a28;
        auVar54._12_4_ = auVar17._12_4_ * fStack_a24;
        auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar32),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar32));
        auVar19._4_4_ = uStack_a0c;
        auVar19._0_4_ = local_a10;
        auVar19._8_4_ = uStack_a08;
        auVar19._12_4_ = uStack_a04;
        auVar17 = vsubps_avx(auVar17,auVar19);
        auVar63._0_4_ = auVar17._0_4_ * local_a40;
        auVar63._4_4_ = auVar17._4_4_ * fStack_a3c;
        auVar63._8_4_ = auVar17._8_4_ * fStack_a38;
        auVar63._12_4_ = auVar17._12_4_ * fStack_a34;
        auVar17 = vmaxps_avx(auVar54,auVar63);
        auVar44 = vmaxps_avx(auVar44,auVar17);
        auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar40),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar40));
        auVar17 = vsubps_avx(auVar17,auVar92._0_16_);
        auVar55._0_4_ = auVar17._0_4_ * local_a50;
        auVar55._4_4_ = auVar17._4_4_ * fStack_a4c;
        auVar55._8_4_ = auVar17._8_4_ * fStack_a48;
        auVar55._12_4_ = auVar17._12_4_ * fStack_a44;
        auVar17._4_4_ = iStack_a8c;
        auVar17._0_4_ = local_a90;
        auVar17._8_4_ = iStack_a88;
        auVar17._12_4_ = iStack_a84;
        auVar17 = vminps_avx(auVar17,auVar55);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar37),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar37));
        auVar50 = vsubps_avx(auVar50,auVar18);
        auVar18 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + local_b38),auVar43,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + local_b38));
        auVar64._0_4_ = auVar50._0_4_ * local_a60;
        auVar64._4_4_ = auVar50._4_4_ * fStack_a5c;
        auVar64._8_4_ = auVar50._8_4_ * fStack_a58;
        auVar64._12_4_ = auVar50._12_4_ * fStack_a54;
        auVar50 = vsubps_avx(auVar18,auVar19);
        auVar69._0_4_ = auVar50._0_4_ * local_a70;
        auVar69._4_4_ = auVar50._4_4_ * fStack_a6c;
        auVar69._8_4_ = auVar50._8_4_ * fStack_a68;
        auVar69._12_4_ = auVar50._12_4_ * fStack_a64;
        auVar50 = vminps_avx(auVar64,auVar69);
        auVar17 = vminps_avx(auVar17,auVar50);
        if (((uint)uVar39 & 7) == 6) {
          auVar17 = vcmpps_avx(auVar44,auVar17,2);
          auVar44 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0xe0),auVar43,2);
          auVar50 = vcmpps_avx(auVar43,*(undefined1 (*) [16])(uVar29 + 0xf0),1);
          auVar44 = vandps_avx(auVar44,auVar50);
          auVar44 = vandps_avx(auVar44,auVar17);
        }
        else {
          auVar44 = vcmpps_avx(auVar44,auVar17,2);
        }
        auVar44 = vpslld_avx(auVar44,0x1f);
        uVar33 = vmovmskps_avx(auVar44);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar33);
      }
      if ((uVar39 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar38 = 4;
        }
        else {
          uVar29 = uVar39 & 0xfffffffffffffff0;
          lVar31 = 0;
          for (uVar39 = unaff_RBX; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar38 = 0;
          for (uVar30 = unaff_RBX - 1 & unaff_RBX; uVar39 = *(ulong *)(uVar29 + lVar31 * 8),
              uVar30 != 0; uVar30 = uVar30 - 1 & uVar30) {
            *puVar34 = uVar39;
            puVar34 = puVar34 + 1;
            lVar31 = 0;
            for (uVar39 = uVar30; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar31 = lVar31 + 1;
            }
          }
        }
      }
      else {
        uVar38 = 6;
      }
    } while (uVar38 == 0);
    uVar29 = uVar37;
    if (uVar38 == 6) {
      uVar38 = 0;
      local_b50 = (ulong)((uint)uVar39 & 0xf) - 8;
      bVar41 = local_b50 != 0;
      if (bVar41) {
        uVar39 = uVar39 & 0xfffffffffffffff0;
        local_b48 = 0;
        do {
          local_be8 = local_b48 * 0x140;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar70._4_4_ = uVar33;
          auVar70._0_4_ = uVar33;
          auVar70._8_4_ = uVar33;
          auVar70._12_4_ = uVar33;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x90 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + local_be8));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xa0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x10 + local_be8));
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xb0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_be8));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xc0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x30 + local_be8));
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xd0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x40 + local_be8));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xe0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x50 + local_be8));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xf0 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x60 + local_be8));
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x100 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x70 + local_be8));
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x110 + local_be8),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x80 + local_be8));
          uVar33 = *(undefined4 *)(ray + k * 4);
          auVar71._4_4_ = uVar33;
          auVar71._0_4_ = uVar33;
          auVar71._8_4_ = uVar33;
          auVar71._12_4_ = uVar33;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar98._4_4_ = uVar33;
          auVar98._0_4_ = uVar33;
          auVar98._8_4_ = uVar33;
          auVar98._12_4_ = uVar33;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar103._4_4_ = uVar33;
          auVar103._0_4_ = uVar33;
          auVar103._8_4_ = uVar33;
          auVar103._12_4_ = uVar33;
          local_b90 = vsubps_avx(auVar44,auVar71);
          local_ba0 = vsubps_avx(auVar17,auVar98);
          local_bb0 = vsubps_avx(auVar50,auVar103);
          auVar44 = vsubps_avx(auVar18,auVar71);
          auVar17 = vsubps_avx(auVar19,auVar98);
          auVar50 = vsubps_avx(auVar43,auVar103);
          auVar18 = vsubps_avx(auVar54,auVar71);
          auVar19 = vsubps_avx(auVar55,auVar98);
          auVar43 = vsubps_avx(auVar63,auVar103);
          local_bc0 = vsubps_avx(auVar18,local_b90);
          local_aa0 = vsubps_avx(auVar19,local_ba0);
          local_b60 = vsubps_avx(auVar43,local_bb0);
          auVar45._0_4_ = auVar18._0_4_ + local_b90._0_4_;
          auVar45._4_4_ = auVar18._4_4_ + local_b90._4_4_;
          auVar45._8_4_ = auVar18._8_4_ + local_b90._8_4_;
          auVar45._12_4_ = auVar18._12_4_ + local_b90._12_4_;
          auVar65._0_4_ = auVar19._0_4_ + local_ba0._0_4_;
          auVar65._4_4_ = auVar19._4_4_ + local_ba0._4_4_;
          auVar65._8_4_ = auVar19._8_4_ + local_ba0._8_4_;
          auVar65._12_4_ = auVar19._12_4_ + local_ba0._12_4_;
          fVar14 = local_bb0._0_4_;
          auVar72._0_4_ = auVar43._0_4_ + fVar14;
          fVar3 = local_bb0._4_4_;
          auVar72._4_4_ = auVar43._4_4_ + fVar3;
          fVar4 = local_bb0._8_4_;
          auVar72._8_4_ = auVar43._8_4_ + fVar4;
          fVar5 = local_bb0._12_4_;
          auVar72._12_4_ = auVar43._12_4_ + fVar5;
          auVar99._0_4_ = auVar65._0_4_ * local_b60._0_4_;
          auVar99._4_4_ = auVar65._4_4_ * local_b60._4_4_;
          auVar99._8_4_ = auVar65._8_4_ * local_b60._8_4_;
          auVar99._12_4_ = auVar65._12_4_ * local_b60._12_4_;
          auVar55 = vfmsub231ps_fma(auVar99,local_aa0,auVar72);
          auVar73._0_4_ = auVar72._0_4_ * local_bc0._0_4_;
          auVar73._4_4_ = auVar72._4_4_ * local_bc0._4_4_;
          auVar73._8_4_ = auVar72._8_4_ * local_bc0._8_4_;
          auVar73._12_4_ = auVar72._12_4_ * local_bc0._12_4_;
          auVar54 = vfmsub231ps_fma(auVar73,local_b60,auVar45);
          auVar46._0_4_ = local_aa0._0_4_ * auVar45._0_4_;
          auVar46._4_4_ = local_aa0._4_4_ * auVar45._4_4_;
          auVar46._8_4_ = local_aa0._8_4_ * auVar45._8_4_;
          auVar46._12_4_ = local_aa0._12_4_ * auVar45._12_4_;
          auVar63 = vfmsub231ps_fma(auVar46,local_bc0,auVar65);
          local_be0._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar94._0_4_ = local_be0._4_4_ * auVar63._0_4_;
          auVar94._4_4_ = local_be0._4_4_ * auVar63._4_4_;
          auVar94._8_4_ = local_be0._4_4_ * auVar63._8_4_;
          auVar94._12_4_ = local_be0._4_4_ * auVar63._12_4_;
          uVar33 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar96._4_4_ = uVar33;
          auVar96._0_4_ = uVar33;
          auVar96._8_4_ = uVar33;
          auVar96._12_4_ = uVar33;
          auVar54 = vfmadd231ps_fma(auVar94,auVar96,auVar54);
          uVar33 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_c00._4_4_ = uVar33;
          local_c00._0_4_ = uVar33;
          local_c00._8_4_ = uVar33;
          local_c00._12_4_ = uVar33;
          local_ad0 = vfmadd231ps_fma(auVar54,local_c00,auVar55);
          local_ab0 = vsubps_avx(local_ba0,auVar17);
          local_ac0 = vsubps_avx(local_bb0,auVar50);
          auVar66._0_4_ = local_ba0._0_4_ + auVar17._0_4_;
          auVar66._4_4_ = local_ba0._4_4_ + auVar17._4_4_;
          auVar66._8_4_ = local_ba0._8_4_ + auVar17._8_4_;
          auVar66._12_4_ = local_ba0._12_4_ + auVar17._12_4_;
          auVar74._0_4_ = fVar14 + auVar50._0_4_;
          auVar74._4_4_ = fVar3 + auVar50._4_4_;
          auVar74._8_4_ = fVar4 + auVar50._8_4_;
          auVar74._12_4_ = fVar5 + auVar50._12_4_;
          fVar6 = local_ac0._0_4_;
          auVar82._0_4_ = auVar66._0_4_ * fVar6;
          fVar8 = local_ac0._4_4_;
          auVar82._4_4_ = auVar66._4_4_ * fVar8;
          fVar10 = local_ac0._8_4_;
          auVar82._8_4_ = auVar66._8_4_ * fVar10;
          fVar12 = local_ac0._12_4_;
          auVar82._12_4_ = auVar66._12_4_ * fVar12;
          auVar63 = vfmsub231ps_fma(auVar82,local_ab0,auVar74);
          auVar54 = vsubps_avx(local_b90,auVar44);
          fVar7 = auVar54._0_4_;
          auVar88._0_4_ = auVar74._0_4_ * fVar7;
          fVar9 = auVar54._4_4_;
          auVar88._4_4_ = auVar74._4_4_ * fVar9;
          fVar11 = auVar54._8_4_;
          auVar88._8_4_ = auVar74._8_4_ * fVar11;
          fVar13 = auVar54._12_4_;
          auVar88._12_4_ = auVar74._12_4_ * fVar13;
          auVar75._0_4_ = local_b90._0_4_ + auVar44._0_4_;
          auVar75._4_4_ = local_b90._4_4_ + auVar44._4_4_;
          auVar75._8_4_ = local_b90._8_4_ + auVar44._8_4_;
          auVar75._12_4_ = local_b90._12_4_ + auVar44._12_4_;
          auVar55 = vfmsub231ps_fma(auVar88,local_ac0,auVar75);
          fVar97 = local_ab0._0_4_;
          auVar76._0_4_ = fVar97 * auVar75._0_4_;
          fVar100 = local_ab0._4_4_;
          auVar76._4_4_ = fVar100 * auVar75._4_4_;
          fVar101 = local_ab0._8_4_;
          auVar76._8_4_ = fVar101 * auVar75._8_4_;
          fVar102 = local_ab0._12_4_;
          auVar76._12_4_ = fVar102 * auVar75._12_4_;
          auVar64 = vfmsub231ps_fma(auVar76,auVar54,auVar66);
          auVar77._0_4_ = local_be0._4_4_ * auVar64._0_4_;
          auVar77._4_4_ = local_be0._4_4_ * auVar64._4_4_;
          auVar77._8_4_ = local_be0._4_4_ * auVar64._8_4_;
          auVar77._12_4_ = local_be0._4_4_ * auVar64._12_4_;
          auVar55 = vfmadd231ps_fma(auVar77,auVar96,auVar55);
          local_9e0 = vfmadd231ps_fma(auVar55,local_c00,auVar63);
          auVar55 = vsubps_avx(auVar44,auVar18);
          auVar56._0_4_ = auVar44._0_4_ + auVar18._0_4_;
          auVar56._4_4_ = auVar44._4_4_ + auVar18._4_4_;
          auVar56._8_4_ = auVar44._8_4_ + auVar18._8_4_;
          auVar56._12_4_ = auVar44._12_4_ + auVar18._12_4_;
          auVar18 = vsubps_avx(auVar17,auVar19);
          auVar51._0_4_ = auVar17._0_4_ + auVar19._0_4_;
          auVar51._4_4_ = auVar17._4_4_ + auVar19._4_4_;
          auVar51._8_4_ = auVar17._8_4_ + auVar19._8_4_;
          auVar51._12_4_ = auVar17._12_4_ + auVar19._12_4_;
          auVar19 = vsubps_avx(auVar50,auVar43);
          auVar78._0_4_ = auVar50._0_4_ + auVar43._0_4_;
          auVar78._4_4_ = auVar50._4_4_ + auVar43._4_4_;
          auVar78._8_4_ = auVar50._8_4_ + auVar43._8_4_;
          auVar78._12_4_ = auVar50._12_4_ + auVar43._12_4_;
          auVar83._0_4_ = auVar19._0_4_ * auVar51._0_4_;
          auVar83._4_4_ = auVar19._4_4_ * auVar51._4_4_;
          auVar83._8_4_ = auVar19._8_4_ * auVar51._8_4_;
          auVar83._12_4_ = auVar19._12_4_ * auVar51._12_4_;
          auVar17 = vfmsub231ps_fma(auVar83,auVar18,auVar78);
          auVar79._0_4_ = auVar78._0_4_ * auVar55._0_4_;
          auVar79._4_4_ = auVar78._4_4_ * auVar55._4_4_;
          auVar79._8_4_ = auVar78._8_4_ * auVar55._8_4_;
          auVar79._12_4_ = auVar78._12_4_ * auVar55._12_4_;
          auVar44 = vfmsub231ps_fma(auVar79,auVar19,auVar56);
          auVar57._0_4_ = auVar18._0_4_ * auVar56._0_4_;
          auVar57._4_4_ = auVar18._4_4_ * auVar56._4_4_;
          auVar57._8_4_ = auVar18._8_4_ * auVar56._8_4_;
          auVar57._12_4_ = auVar18._12_4_ * auVar56._12_4_;
          auVar50 = vfmsub231ps_fma(auVar57,auVar55,auVar51);
          local_be0._0_4_ = local_be0._4_4_;
          fStack_bd8 = local_be0._4_4_;
          fStack_bd4 = local_be0._4_4_;
          auVar58._0_4_ = local_be0._4_4_ * auVar50._0_4_;
          auVar58._4_4_ = local_be0._4_4_ * auVar50._4_4_;
          auVar58._8_4_ = local_be0._4_4_ * auVar50._8_4_;
          auVar58._12_4_ = local_be0._4_4_ * auVar50._12_4_;
          auVar44 = vfmadd231ps_fma(auVar58,auVar96,auVar44);
          auVar50 = vfmadd231ps_fma(auVar44,local_c00,auVar17);
          local_9f0 = local_ad0._0_4_;
          fStack_9ec = local_ad0._4_4_;
          fStack_9e8 = local_ad0._8_4_;
          fStack_9e4 = local_ad0._12_4_;
          local_9d0._0_4_ = auVar50._0_4_ + local_9f0 + local_9e0._0_4_;
          local_9d0._4_4_ = auVar50._4_4_ + fStack_9ec + local_9e0._4_4_;
          local_9d0._8_4_ = auVar50._8_4_ + fStack_9e8 + local_9e0._8_4_;
          local_9d0._12_4_ = auVar50._12_4_ + fStack_9e4 + local_9e0._12_4_;
          auVar52._8_4_ = 0x7fffffff;
          auVar52._0_8_ = 0x7fffffff7fffffff;
          auVar52._12_4_ = 0x7fffffff;
          auVar44 = vminps_avx(local_ad0,local_9e0);
          auVar44 = vminps_avx(auVar44,auVar50);
          local_ae0 = vandps_avx(local_9d0,auVar52);
          auVar89._0_4_ = local_ae0._0_4_ * 1.1920929e-07;
          auVar89._4_4_ = local_ae0._4_4_ * 1.1920929e-07;
          auVar89._8_4_ = local_ae0._8_4_ * 1.1920929e-07;
          auVar89._12_4_ = local_ae0._12_4_ * 1.1920929e-07;
          uVar40 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
          auVar84._0_8_ = uVar40 ^ 0x8000000080000000;
          auVar84._8_4_ = -auVar89._8_4_;
          auVar84._12_4_ = -auVar89._12_4_;
          auVar44 = vcmpps_avx(auVar44,auVar84,5);
          auVar17 = vmaxps_avx(local_ad0,local_9e0);
          auVar17 = vmaxps_avx(auVar17,auVar50);
          auVar17 = vcmpps_avx(auVar17,auVar89,2);
          auVar92 = ZEXT1664(local_b70);
          auVar44 = vorps_avx(auVar44,auVar17);
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            auVar59._0_4_ = local_b60._0_4_ * fVar97;
            auVar59._4_4_ = local_b60._4_4_ * fVar100;
            auVar59._8_4_ = local_b60._8_4_ * fVar101;
            auVar59._12_4_ = local_b60._12_4_ * fVar102;
            auVar80._0_4_ = fVar7 * local_aa0._0_4_;
            auVar80._4_4_ = fVar9 * local_aa0._4_4_;
            auVar80._8_4_ = fVar11 * local_aa0._8_4_;
            auVar80._12_4_ = fVar13 * local_aa0._12_4_;
            auVar43 = vfmsub213ps_fma(local_aa0,local_ac0,auVar59);
            auVar85._0_4_ = auVar18._0_4_ * fVar6;
            auVar85._4_4_ = auVar18._4_4_ * fVar8;
            auVar85._8_4_ = auVar18._8_4_ * fVar10;
            auVar85._12_4_ = auVar18._12_4_ * fVar12;
            auVar90._0_4_ = fVar7 * auVar19._0_4_;
            auVar90._4_4_ = fVar9 * auVar19._4_4_;
            auVar90._8_4_ = fVar11 * auVar19._8_4_;
            auVar90._12_4_ = fVar13 * auVar19._12_4_;
            auVar19 = vfmsub213ps_fma(auVar19,local_ab0,auVar85);
            auVar17 = vandps_avx(auVar59,auVar52);
            auVar50 = vandps_avx(auVar85,auVar52);
            auVar17 = vcmpps_avx(auVar17,auVar50,1);
            local_970 = vblendvps_avx(auVar19,auVar43,auVar17);
            auVar86._0_4_ = auVar55._0_4_ * fVar97;
            auVar86._4_4_ = auVar55._4_4_ * fVar100;
            auVar86._8_4_ = auVar55._8_4_ * fVar101;
            auVar86._12_4_ = auVar55._12_4_ * fVar102;
            auVar19 = vfmsub213ps_fma(auVar55,local_ac0,auVar90);
            auVar60._0_4_ = local_bc0._0_4_ * fVar6;
            auVar60._4_4_ = local_bc0._4_4_ * fVar8;
            auVar60._8_4_ = local_bc0._8_4_ * fVar10;
            auVar60._12_4_ = local_bc0._12_4_ * fVar12;
            auVar43 = vfmsub213ps_fma(local_b60,auVar54,auVar60);
            auVar17 = vandps_avx(auVar60,auVar52);
            auVar50 = vandps_avx(auVar90,auVar52);
            auVar17 = vcmpps_avx(auVar17,auVar50,1);
            local_960 = vblendvps_avx(auVar19,auVar43,auVar17);
            auVar19 = vfmsub213ps_fma(local_bc0,local_ab0,auVar80);
            auVar18 = vfmsub213ps_fma(auVar18,auVar54,auVar86);
            auVar17 = vandps_avx(auVar80,auVar52);
            auVar50 = vandps_avx(auVar86,auVar52);
            auVar17 = vcmpps_avx(auVar17,auVar50,1);
            local_950 = vblendvps_avx(auVar18,auVar19,auVar17);
            auVar67._0_4_ = local_950._0_4_ * local_be0._4_4_;
            auVar67._4_4_ = local_950._4_4_ * local_be0._4_4_;
            auVar67._8_4_ = local_950._8_4_ * local_be0._4_4_;
            auVar67._12_4_ = local_950._12_4_ * local_be0._4_4_;
            auVar17 = vfmadd213ps_fma(auVar96,local_960,auVar67);
            auVar17 = vfmadd213ps_fma(local_c00,local_970,auVar17);
            auVar81._0_4_ = auVar17._0_4_ + auVar17._0_4_;
            auVar81._4_4_ = auVar17._4_4_ + auVar17._4_4_;
            auVar81._8_4_ = auVar17._8_4_ + auVar17._8_4_;
            auVar81._12_4_ = auVar17._12_4_ + auVar17._12_4_;
            auVar68._0_4_ = local_950._0_4_ * fVar14;
            auVar68._4_4_ = local_950._4_4_ * fVar3;
            auVar68._8_4_ = local_950._8_4_ * fVar4;
            auVar68._12_4_ = local_950._12_4_ * fVar5;
            auVar17 = vfmadd213ps_fma(local_ba0,local_960,auVar68);
            auVar50 = vfmadd213ps_fma(local_b90,local_970,auVar17);
            auVar17 = vrcpps_avx(auVar81);
            auVar95._8_4_ = 0x3f800000;
            auVar95._0_8_ = &DAT_3f8000003f800000;
            auVar95._12_4_ = 0x3f800000;
            auVar18 = vfnmadd213ps_fma(auVar17,auVar81,auVar95);
            auVar17 = vfmadd132ps_fma(auVar18,auVar17,auVar17);
            local_980._0_4_ = (auVar50._0_4_ + auVar50._0_4_) * auVar17._0_4_;
            local_980._4_4_ = (auVar50._4_4_ + auVar50._4_4_) * auVar17._4_4_;
            local_980._8_4_ = (auVar50._8_4_ + auVar50._8_4_) * auVar17._8_4_;
            local_980._12_4_ = (auVar50._12_4_ + auVar50._12_4_) * auVar17._12_4_;
            uVar33 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar87._4_4_ = uVar33;
            auVar87._0_4_ = uVar33;
            auVar87._8_4_ = uVar33;
            auVar87._12_4_ = uVar33;
            auVar17 = vcmpps_avx(auVar87,local_980,2);
            uVar33 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar91._4_4_ = uVar33;
            auVar91._0_4_ = uVar33;
            auVar91._8_4_ = uVar33;
            auVar91._12_4_ = uVar33;
            auVar50 = vcmpps_avx(local_980,auVar91,2);
            auVar17 = vandps_avx(auVar17,auVar50);
            auVar92 = ZEXT1664(local_b70);
            auVar50 = auVar44 & auVar17;
            if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              auVar44 = vandps_avx(auVar44,auVar17);
              auVar17 = vcmpps_avx(auVar81,_DAT_01feba10,4);
              auVar50 = auVar17 & auVar44;
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                local_be8 = local_be8 + uVar39;
                local_9b0 = vandps_avx(auVar44,auVar17);
                local_9c0 = &local_c01;
                uStack_bc8 = auVar96._8_8_;
                local_bd0 = context->scene;
                auVar44 = vrcpps_avx(local_9d0);
                auVar61._8_4_ = 0x3f800000;
                auVar61._0_8_ = &DAT_3f8000003f800000;
                auVar61._12_4_ = 0x3f800000;
                auVar17 = vfnmadd213ps_fma(local_9d0,auVar44,auVar61);
                auVar17 = vfmadd132ps_fma(auVar17,auVar44,auVar44);
                auVar53._8_4_ = 0x219392ef;
                auVar53._0_8_ = 0x219392ef219392ef;
                auVar53._12_4_ = 0x219392ef;
                auVar44 = vcmpps_avx(local_ae0,auVar53,5);
                auVar44 = vandps_avx(auVar17,auVar44);
                auVar47._0_4_ = local_9f0 * auVar44._0_4_;
                auVar47._4_4_ = fStack_9ec * auVar44._4_4_;
                auVar47._8_4_ = fStack_9e8 * auVar44._8_4_;
                auVar47._12_4_ = fStack_9e4 * auVar44._12_4_;
                local_9a0 = vminps_avx(auVar47,auVar61);
                auVar48._0_4_ = auVar44._0_4_ * local_9e0._0_4_;
                auVar48._4_4_ = auVar44._4_4_ * local_9e0._4_4_;
                auVar48._8_4_ = auVar44._8_4_ * local_9e0._8_4_;
                auVar48._12_4_ = auVar44._12_4_ * local_9e0._12_4_;
                local_990 = vminps_avx(auVar48,auVar61);
                uVar33 = vmovmskps_avx(local_9b0);
                uVar37 = CONCAT44((int)(uVar37 >> 0x20),uVar33);
                do {
                  uVar40 = 0;
                  for (uVar29 = uVar37; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                      ) {
                    uVar40 = uVar40 + 1;
                  }
                  uVar38 = *(uint *)(local_be8 + 0x120 + uVar40 * 4);
                  lVar31 = *(long *)(*(long *)((long)local_bd0 + 0x1e8) + (ulong)uVar38 * 8);
                  if ((*(uint *)(lVar31 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar37 = uVar37 ^ 1L << (uVar40 & 0x3f);
                    bVar42 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (*(long *)(lVar31 + 0x48) == 0)) {
                    bVar42 = false;
                  }
                  else {
                    local_be0 = uVar32;
                    uVar32 = (ulong)(uint)((int)uVar40 * 4);
                    uVar93 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_8c0 = *(undefined4 *)(local_9a0 + uVar32);
                    uVar33 = *(undefined4 *)(local_990 + uVar32);
                    local_8a0._4_4_ = uVar33;
                    local_8a0._0_4_ = uVar33;
                    local_8a0._8_4_ = uVar33;
                    local_8a0._12_4_ = uVar33;
                    local_8a0._16_4_ = uVar33;
                    local_8a0._20_4_ = uVar33;
                    local_8a0._24_4_ = uVar33;
                    local_8a0._28_4_ = uVar33;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar32);
                    local_b30.context = context->user;
                    uVar33 = *(undefined4 *)(local_be8 + 0x130 + uVar32);
                    local_880._4_4_ = uVar33;
                    local_880._0_4_ = uVar33;
                    local_880._8_4_ = uVar33;
                    local_880._12_4_ = uVar33;
                    local_880._16_4_ = uVar33;
                    local_880._20_4_ = uVar33;
                    local_880._24_4_ = uVar33;
                    local_880._28_4_ = uVar33;
                    uVar33 = *(undefined4 *)(local_970 + uVar32);
                    uVar1 = *(undefined4 *)(local_960 + uVar32);
                    local_900._4_4_ = uVar1;
                    local_900._0_4_ = uVar1;
                    local_900._8_4_ = uVar1;
                    local_900._12_4_ = uVar1;
                    local_900._16_4_ = uVar1;
                    local_900._20_4_ = uVar1;
                    local_900._24_4_ = uVar1;
                    local_900._28_4_ = uVar1;
                    uVar1 = *(undefined4 *)(local_950 + uVar32);
                    local_8e0._4_4_ = uVar1;
                    local_8e0._0_4_ = uVar1;
                    local_8e0._8_4_ = uVar1;
                    local_8e0._12_4_ = uVar1;
                    local_8e0._16_4_ = uVar1;
                    local_8e0._20_4_ = uVar1;
                    local_8e0._24_4_ = uVar1;
                    local_8e0._28_4_ = uVar1;
                    local_860._4_4_ = uVar38;
                    local_860._0_4_ = uVar38;
                    local_860._8_4_ = uVar38;
                    local_860._12_4_ = uVar38;
                    local_860._16_4_ = uVar38;
                    local_860._20_4_ = uVar38;
                    local_860._24_4_ = uVar38;
                    local_860._28_4_ = uVar38;
                    local_920[0] = (RTCHitN)(char)uVar33;
                    local_920[1] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[2] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[3] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[4] = (RTCHitN)(char)uVar33;
                    local_920[5] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[6] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[7] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[8] = (RTCHitN)(char)uVar33;
                    local_920[9] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[10] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0xb] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[0xc] = (RTCHitN)(char)uVar33;
                    local_920[0xd] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[0xe] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0xf] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[0x10] = (RTCHitN)(char)uVar33;
                    local_920[0x11] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[0x12] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0x13] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[0x14] = (RTCHitN)(char)uVar33;
                    local_920[0x15] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[0x16] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0x17] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[0x18] = (RTCHitN)(char)uVar33;
                    local_920[0x19] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[0x1a] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0x1b] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    local_920[0x1c] = (RTCHitN)(char)uVar33;
                    local_920[0x1d] = (RTCHitN)(char)((uint)uVar33 >> 8);
                    local_920[0x1e] = (RTCHitN)(char)((uint)uVar33 >> 0x10);
                    local_920[0x1f] = (RTCHitN)(char)((uint)uVar33 >> 0x18);
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    auVar49 = vpcmpeqd_avx2(local_860,local_860);
                    uStack_83c = (local_b30.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_b30.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_b00 = local_940._0_8_;
                    uStack_af8 = local_940._8_8_;
                    uStack_af0 = local_940._16_8_;
                    uStack_ae8 = local_940._24_8_;
                    local_b30.valid = (int *)&local_b00;
                    local_b30.geometryUserPtr = *(void **)(lVar31 + 0x18);
                    local_b30.hit = local_920;
                    local_b30.N = 8;
                    local_b30.ray = (RTCRayN *)ray;
                    if (*(code **)(lVar31 + 0x48) != (code *)0x0) {
                      local_c00._0_8_ = ray;
                      local_b60._0_8_ = k;
                      local_b90._0_8_ = puVar34;
                      local_ba0._0_8_ = uVar35;
                      local_bb0._0_8_ = uVar36;
                      local_bc0._0_4_ = uVar93;
                      auVar49 = ZEXT1632(auVar49._0_16_);
                      (**(code **)(lVar31 + 0x48))(&local_b30);
                      auVar49 = vpcmpeqd_avx2(auVar49,auVar49);
                      auVar92 = ZEXT1664(local_b70);
                      k = local_b60._0_8_;
                      puVar34 = (ulong *)local_b90._0_8_;
                      ray = (RayK<8> *)local_c00._0_8_;
                      uVar35 = local_ba0._0_8_;
                      uVar36 = local_bb0._0_8_;
                      uVar93 = local_bc0._0_4_;
                    }
                    auVar16._8_8_ = uStack_af8;
                    auVar16._0_8_ = local_b00;
                    auVar16._16_8_ = uStack_af0;
                    auVar16._24_8_ = uStack_ae8;
                    auVar15 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
                    auVar16 = auVar49 & ~auVar15;
                    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar16 >> 0x7f,0) == '\0') &&
                          (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar16 >> 0xbf,0) == '\0') &&
                        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar16[0x1f]) {
                      auVar15 = auVar15 ^ auVar49;
                      uVar32 = local_be0;
                    }
                    else {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar31 + 0x3e) & 0x40) != 0)
                          ))) {
                        local_c00._0_8_ = ray;
                        local_b90._0_8_ = puVar34;
                        local_ba0._0_8_ = uVar35;
                        local_bb0._0_8_ = uVar36;
                        local_bc0._0_4_ = uVar93;
                        auVar49 = ZEXT1632(auVar49._0_16_);
                        (*p_Var2)(&local_b30);
                        auVar49 = vpcmpeqd_avx2(auVar49,auVar49);
                        auVar92 = ZEXT1664(local_b70);
                        puVar34 = (ulong *)local_b90._0_8_;
                        ray = (RayK<8> *)local_c00._0_8_;
                        uVar35 = local_ba0._0_8_;
                        uVar36 = local_bb0._0_8_;
                        uVar93 = local_bc0._0_4_;
                      }
                      auVar15._8_8_ = uStack_af8;
                      auVar15._0_8_ = local_b00;
                      auVar15._16_8_ = uStack_af0;
                      auVar15._24_8_ = uStack_ae8;
                      auVar16 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar15);
                      auVar15 = auVar16 ^ auVar49;
                      auVar62._8_4_ = 0xff800000;
                      auVar62._0_8_ = 0xff800000ff800000;
                      auVar62._12_4_ = 0xff800000;
                      auVar62._16_4_ = 0xff800000;
                      auVar62._20_4_ = 0xff800000;
                      auVar62._24_4_ = 0xff800000;
                      auVar62._28_4_ = 0xff800000;
                      auVar49 = vblendvps_avx(auVar62,*(undefined1 (*) [32])(local_b30.ray + 0x100),
                                              auVar16);
                      *(undefined1 (*) [32])(local_b30.ray + 0x100) = auVar49;
                      uVar32 = local_be0;
                    }
                    bVar26 = (auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar27 = (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar25 = (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar24 = SUB321(auVar15 >> 0x7f,0) == '\0';
                    bVar23 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar22 = SUB321(auVar15 >> 0xbf,0) == '\0';
                    bVar21 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar20 = -1 < auVar15[0x1f];
                    bVar42 = ((((((bVar26 && bVar27) && bVar25) && bVar24) && bVar23) && bVar22) &&
                             bVar21) && bVar20;
                    if (((((((bVar26 && bVar27) && bVar25) && bVar24) && bVar23) && bVar22) &&
                        bVar21) && bVar20) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar93;
                      uVar37 = uVar37 ^ 1L << (uVar40 & 0x3f);
                    }
                  }
                  uVar38 = 0;
                  if (!bVar42) {
                    uVar29 = local_b80;
                    uVar40 = local_b78;
                    if (bVar41) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar38 = 1;
                    }
                    goto LAB_005e4b45;
                  }
                } while (uVar37 != 0);
                uVar37 = 0;
              }
            }
          }
          uVar38 = 0;
          local_b48 = local_b48 + 1;
          bVar41 = local_b48 < local_b50;
          uVar29 = local_b80;
          uVar40 = local_b78;
        } while (local_b48 != local_b50);
      }
    }
LAB_005e4b45:
    uVar37 = uVar29;
  } while ((uVar38 & 3) == 0);
  return local_b40 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }